

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O0

void __thiscall CCtrlSystem::CCtrlSystem(CCtrlSystem *this)

{
  undefined1 auVar1 [16];
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 *in_RDI;
  int size;
  char ch;
  ifstream ifs;
  CCtrlSystem *in_stack_000000b0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  istream local_210 [528];
  
  std::ifstream::ifstream(local_210);
  std::ifstream::open((char *)local_210,0x1070c2);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"File is not exist! ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    *in_RDI = 1;
    in_RDI[1] = 0;
    *(undefined8 *)(in_RDI + 2) = 0;
    std::ifstream::close();
  }
  else {
    std::operator>>(local_210,&stack0xfffffffffffffddf);
    bVar2 = std::ios::eof();
    if ((bVar2 & 1) == 0) {
      iVar3 = getSize((CCtrlSystem *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      (ifstream *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      *in_RDI = 0;
      in_RDI[1] = iVar3;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)in_RDI[1];
      uVar5 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5);
      *(void **)(in_RDI + 2) = pvVar6;
      initArray(in_stack_000000b0);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"File exist but is empty! ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      *in_RDI = 1;
      in_RDI[1] = 0;
      *(undefined8 *)(in_RDI + 2) = 0;
      std::ifstream::close();
    }
  }
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

CCtrlSystem::CCtrlSystem(/* args */)
{
	ifstream ifs;
	ifs.open(FILENAME, ios::in);
	if (!ifs.is_open())
	{
		cout << "File is not exist! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;

		
	}
	char ch;
	ifs >> ch;
	if (ifs.eof())
	{
		cout << "File exist but is empty! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;
	}
	else
	{
		int size = this->getSize(ifs);
		// cout << "Workers' number is: " << size << endl;
		this->_isFileEmpty = false;
		this->_size = size;
		this->_p_workerArray = new CWorker *[this->_size];
		this->initArray();
	}
}